

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O3

void __thiscall
helics::TranslatorFederate::handleMessage(TranslatorFederate *this,ActionMessage *command)

{
  TimeCoordinator *timeCoord;
  ushort uVar1;
  action_t aVar2;
  uint uVar3;
  size_type __len2;
  GlobalHandle dest;
  GlobalHandle sourceToRemove;
  GlobalHandle subscriberToRemove;
  tuple<helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_> tVar4;
  GlobalHandle targetId;
  size_t sVar5;
  pointer pcVar6;
  size_type sVar7;
  GlobalHandle newSubscriber;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint __val;
  string_view sunits;
  _func_void__Op_any_ptr__Arg_ptr *p_Var8;
  _Storage _Var9;
  undefined8 __len1;
  uint uVar10;
  FederateStates FVar11;
  int iVar12;
  TranslatorInfo *pTVar13;
  char *__s;
  size_t __len2_00;
  const_iterator cVar14;
  string *psVar15;
  AirLock<std::any,_std::mutex,_std::condition_variable> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  uint __len;
  string_view sourceName;
  string_view sourceName_00;
  string_view subscriberName;
  string_view destName;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view sourceType;
  string_view stype;
  string_view destType;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  ActionMessage disconnect;
  int in_stack_fffffffffffffe9c;
  helics local_153;
  char local_152;
  FederateStates local_151;
  byte *local_150;
  any local_148;
  element_type local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  GlobalHandle local_100;
  size_t local_f8;
  char *pcStack_f0;
  _Storage<std::any,_false> local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  timeCoord = &this->mCoord;
  processCoordinatorMessage
            (&local_153,command,timeCoord,this->current_state,false,
             (GlobalFederateId)(this->mFedID).gid);
  FVar11 = this->current_state;
  if ((FVar11 == EXECUTING & (byte)local_153) == 1) {
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
    ActionMessage::ActionMessage((ActionMessage *)&local_e8._M_value,cmd_disconnect);
    local_e8._8_4_ = (this->mFedID).gid;
    local_d8[0]._M_allocated_capacity._0_4_ = 0;
    if ((this->mQueueMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->mQueueMessage)._M_invoker)
              ((_Any_data *)&this->mQueueMessage,(ActionMessage *)&local_e8._M_value);
    ActionMessage::~ActionMessage((ActionMessage *)&local_e8._M_value);
    FVar11 = this->current_state;
  }
  if (FVar11 != local_151) {
    this->current_state = local_151;
    if (local_151 == ERRORED) {
      local_e8._M_value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)local_d8;
      local_e8._M_value._M_storage._M_ptr = (_Storage)0x0;
      local_d8[0]._M_allocated_capacity._0_4_ =
           (undefined4)local_d8[0]._M_allocated_capacity & 0xffffff00;
      __len2 = (command->payload).bufferSize;
      if (__len2 == 0) {
        __s = commandErrorString(in_stack_fffffffffffffe9c);
        __len1 = local_e8._M_value._M_storage;
        __len2_00 = strlen(__s);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_e8._M_value,0,__len1,__s,__len2_00);
        iVar12 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_e8._M_value,"unknown");
        if (iVar12 == 0) {
          uVar3 = command->messageID;
          __val = -uVar3;
          if (0 < (int)uVar3) {
            __val = uVar3;
          }
          __len = 1;
          if (9 < __val) {
            uVar19 = (ulong)__val;
            uVar10 = 4;
            do {
              __len = uVar10;
              uVar17 = (uint)uVar19;
              if (uVar17 < 100) {
                __len = __len - 2;
                goto LAB_0036c973;
              }
              if (uVar17 < 1000) {
                __len = __len - 1;
                goto LAB_0036c973;
              }
              if (uVar17 < 10000) goto LAB_0036c973;
              uVar19 = uVar19 / 10000;
              uVar10 = __len + 4;
            } while (99999 < uVar17);
            __len = __len + 1;
          }
LAB_0036c973:
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_120,(ulong)(-((int)uVar3 >> 0x1f) + __len),'-');
          CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_120._M_dataplus._M_p + (uint)-((int)uVar3 >> 0x1f),__len,__val);
          pbVar16 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                              (&local_120,0,0," code:",6);
          local_148._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)(pbVar16->_M_dataplus)._M_p;
          paVar18 = &pbVar16->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_manager == paVar18) {
            local_138._vptr_TranslatorOperator = (_func_int **)paVar18->_M_allocated_capacity;
            local_138.minDelay.internalTimeCode = *(baseType *)((long)&pbVar16->field_2 + 8);
            local_148._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_138;
          }
          else {
            local_138._vptr_TranslatorOperator = (_func_int **)paVar18->_M_allocated_capacity;
          }
          local_148._M_storage = (_Storage)pbVar16->_M_string_length;
          (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar16->_M_string_length = 0;
          (pbVar16->field_2)._M_local_buf[0] = '\0';
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_e8._M_value,(char *)local_148._M_manager,(size_type)local_148._M_storage)
          ;
          if ((element_type *)local_148._M_manager != &local_138) {
            operator_delete(local_148._M_manager,(long)local_138._vptr_TranslatorOperator + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_e8._M_value,0,0,(char *)(command->payload).heap,__len2);
      }
      if ((this->mLogger).super__Function_base._M_manager != (_Manager_type)0x0) {
        __args_1._M_str = (this->mName)._M_dataplus._M_p;
        __args_1._M_len = (this->mName)._M_string_length;
        __args_2._M_str = (char *)local_e8._M_value._M_manager;
        __args_2._M_len = (size_t)local_e8._M_value._M_storage;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&this->mLogger,0,__args_1,__args_2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_value._M_manager != local_d8) {
        operator_delete(local_e8._M_value._M_manager,
                        CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_d8[0]._M_allocated_capacity) + 1);
      }
    }
    else if (local_151 == EXECUTING) {
      TimeCoordinator::timeRequest
                (timeCoord,(Time)0x7fffffffffffffff,NO_ITERATIONS,(Time)0x7fffffffffffffff,
                 (Time)0x7fffffffffffffff);
    }
    else if (local_151 == INITIALIZING) {
      TimeCoordinator::enteringExecMode(timeCoord,NO_ITERATIONS);
      ActionMessage::ActionMessage((ActionMessage *)&local_e8._M_value,cmd_exec_check);
      local_d8[0]._0_4_ = (this->mFedID).gid;
      local_e8._8_4_ = local_d8[0]._0_4_;
      handleMessage(this,(ActionMessage *)&local_e8._M_value);
      ActionMessage::~ActionMessage((ActionMessage *)&local_e8._M_value);
    }
  }
  if (local_152 != -2) {
    if (local_152 != '\b') {
      return;
    }
    if ((command->dest_id).gid == (this->mFedID).gid) {
      handleMessage(this,command);
      return;
    }
    if ((this->mSendMessage).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->mSendMessage)._M_invoker)((_Any_data *)&this->mSendMessage,command);
      return;
    }
LAB_0036cab8:
    std::__throw_bad_function_call();
  }
  aVar2 = command->messageAction;
  if (aVar2 < cmd_close_interface) {
    if (0x45 < aVar2) {
      if (aVar2 == cmd_add_subscriber) {
        pTVar13 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                    (InterfaceHandle)(command->dest_handle).hid);
        if (pTVar13 == (TranslatorInfo *)0x0) {
          return;
        }
        newSubscriber.fed_id.gid = (command->source_id).gid;
        newSubscriber.handle.hid = (command->source_handle).hid;
        subscriberName._M_str = (char *)(command->payload).heap;
        subscriberName._M_len = (command->payload).bufferSize;
        PublicationInfo::addSubscriber(&pTVar13->pub,newSubscriber,subscriberName);
      }
      else {
        if (aVar2 != cmd_add_endpoint) {
          return;
        }
        pTVar13 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                    (InterfaceHandle)(command->dest_handle).hid);
        if (pTVar13 == (TranslatorInfo *)0x0) {
          return;
        }
        uVar1 = command->flags;
        local_150 = (command->payload).heap;
        dest.fed_id.gid = (command->source_id).gid;
        dest.handle.hid = (command->source_handle).hid;
        sVar5 = (command->payload).bufferSize;
        psVar15 = ActionMessage::getString_abi_cxx11_(command,0);
        pcVar6 = (psVar15->_M_dataplus)._M_p;
        if ((uVar1 & 2) == 0) {
          sourceName._M_str = (char *)local_150;
          sourceName._M_len = sVar5;
          sourceType._M_str = pcVar6;
          sourceType._M_len = psVar15->_M_string_length;
          EndpointInfo::addSource(&pTVar13->ept,dest,sourceName,sourceType);
          goto LAB_0036c826;
        }
        destName._M_str = (char *)local_150;
        destName._M_len = sVar5;
        destType._M_str = pcVar6;
        destType._M_len = psVar15->_M_string_length;
        EndpointInfo::addDestination(&pTVar13->ept,dest,destName,destType);
      }
      if ((command->flags & 0x10) != 0) {
        return;
      }
      TimeCoordinator::addDependent(timeCoord,(GlobalFederateId)(command->source_id).gid);
      return;
    }
    if (aVar2 == cmd_add_publisher) {
      pTVar13 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                  (InterfaceHandle)(command->dest_handle).hid);
      if (pTVar13 == (TranslatorInfo *)0x0) {
        return;
      }
      local_150 = (command->payload).heap;
      local_100.fed_id.gid = (command->source_id).gid;
      local_100.handle.hid = (command->source_handle).hid;
      sVar5 = (command->payload).bufferSize;
      psVar15 = ActionMessage::getString_abi_cxx11_(command,0);
      pcVar6 = (psVar15->_M_dataplus)._M_p;
      sVar7 = psVar15->_M_string_length;
      psVar15 = ActionMessage::getString_abi_cxx11_(command,1);
      pcStack_f0 = (psVar15->_M_dataplus)._M_p;
      local_f8 = psVar15->_M_string_length;
      sunits._M_str = pcStack_f0;
      sunits._M_len = local_f8;
      sourceName_00._M_str = (char *)local_150;
      sourceName_00._M_len = sVar5;
      stype._M_str = pcVar6;
      stype._M_len = sVar7;
      InputInfo::addSource(&pTVar13->ipt,local_100,sourceName_00,stype,sunits);
LAB_0036c826:
      if ((command->flags & 0x10) != 0) {
        return;
      }
      TimeCoordinator::addDependency(timeCoord,(GlobalFederateId)(command->source_id).gid);
      return;
    }
    if (aVar2 != cmd_pub) {
      return;
    }
LAB_0036c537:
    pTVar13 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                (InterfaceHandle)(command->dest_handle).hid);
    if (pTVar13 != (TranslatorInfo *)0x0) {
      executeTranslator(this,command,pTVar13);
    }
  }
  else {
    switch(aVar2) {
    case cmd_close_interface:
      local_e8._M_value._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)*(undefined8 *)&command->source_id;
      std::
      _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::find(&(this->translators).lookup._M_h,(key_type *)&local_e8._M_value);
      break;
    case cmd_remove_subscriber:
      local_e8._M_value._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)*(undefined8 *)&command->dest_id;
      cVar14 = std::
               _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->translators).lookup._M_h,(key_type *)&local_e8._M_value);
      if ((cVar14.
           super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
           _M_cur != (__node_type *)0x0) &&
         (tVar4.
          super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
          .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                 *)&(this->translators).dataStorage.
                    super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(long *)((long)cVar14.
                                     super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                                     ._M_cur + 0x10)]._M_t.
                    super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
         , tVar4.
           super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
           .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl !=
           (_Head_base<0UL,_helics::TranslatorInfo_*,_false>)0x0)) {
        subscriberToRemove.fed_id.gid = (command->source_id).gid;
        subscriberToRemove.handle.hid = (command->source_handle).hid;
        PublicationInfo::removeSubscriber
                  ((PublicationInfo *)
                   ((long)tVar4.
                          super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                          .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl +
                   0x40),subscriberToRemove);
      }
      break;
    case cmd_remove_filter:
      break;
    case cmd_remove_publication:
      local_e8._M_value._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)*(undefined8 *)&command->dest_id;
      cVar14 = std::
               _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->translators).lookup._M_h,(key_type *)&local_e8._M_value);
      if ((cVar14.
           super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
           _M_cur != (__node_type *)0x0) &&
         (tVar4.
          super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
          .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                 *)&(this->translators).dataStorage.
                    super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(long *)((long)cVar14.
                                     super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                                     ._M_cur + 0x10)]._M_t.
                    super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
         , tVar4.
           super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
           .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl !=
           (_Head_base<0UL,_helics::TranslatorInfo_*,_false>)0x0)) {
        sourceToRemove.fed_id.gid = (command->source_id).gid;
        sourceToRemove.handle.hid = (command->source_handle).hid;
        InputInfo::removeSource
                  ((InputInfo *)
                   ((long)tVar4.
                          super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                          .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl +
                   0x158),sourceToRemove,(Time)0x0);
      }
      break;
    case cmd_remove_endpoint:
      local_e8._M_value._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)*(undefined8 *)&command->dest_id;
      cVar14 = std::
               _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->translators).lookup._M_h,(key_type *)&local_e8._M_value);
      if ((cVar14.
           super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
           _M_cur != (__node_type *)0x0) &&
         (tVar4.
          super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
          .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                 *)&(this->translators).dataStorage.
                    super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(long *)((long)cVar14.
                                     super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                                     ._M_cur + 0x10)]._M_t.
                    super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
         , tVar4.
           super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
           .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl !=
           (_Head_base<0UL,_helics::TranslatorInfo_*,_false>)0x0)) {
        targetId.fed_id.gid = (command->source_id).gid;
        targetId.handle.hid = (command->source_handle).hid;
        EndpointInfo::removeTarget
                  ((EndpointInfo *)
                   ((long)tVar4.
                          super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                          .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl +
                   0x2e0),targetId);
      }
      break;
    default:
      if (aVar2 == cmd_core_configure) {
        if (command->messageID != 0x23e) {
          return;
        }
        pTVar13 = getTranslatorInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                    (InterfaceHandle)(command->source_handle).hid);
        if (pTVar13 == (TranslatorInfo *)0x0) {
          return;
        }
        local_148._M_manager =
             (_func_void__Op_any_ptr__Arg_ptr *)
             CONCAT44(local_148._M_manager._4_4_,(uint)command->counter);
        if ((this->mGetAirLock).super__Function_base._M_manager != (_Manager_type)0x0) {
          this_01 = (*(this->mGetAirLock)._M_invoker)
                              ((_Any_data *)&this->mGetAirLock,(int *)&local_148);
          gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                    ((optional<std::any> *)&local_e8._M_value,this_01);
          if (local_d8[0]._M_local_buf[0] == 1) {
            std::any_cast<std::shared_ptr<helics::TranslatorOperator>>(&local_148);
            _Var9 = local_148._M_storage;
            p_Var8 = local_148._M_manager;
            local_148._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
            local_148._M_storage._M_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (pTVar13->tranOp).
                      super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (pTVar13->tranOp).
            super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)p_Var8;
            (pTVar13->tranOp).
            super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9;
            if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_storage._M_ptr !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._M_storage._M_ptr
                        );
            }
          }
          if ((local_d8[0]._0_1_ & 1) == 0) {
            return;
          }
          std::_Optional_payload_base<std::any>::_M_destroy
                    ((_Optional_payload_base<std::any> *)&local_e8._M_value);
          return;
        }
        goto LAB_0036cab8;
      }
      if (aVar2 != cmd_send_message) {
        return;
      }
      goto LAB_0036c537;
    }
  }
  return;
}

Assistant:

void TranslatorFederate::handleMessage(ActionMessage& command)
{
    auto proc_result = processCoordinatorMessage(command, &mCoord, current_state, false, mFedID);

    if (std::get<2>(proc_result) && current_state == FederateStates::EXECUTING) {
        mCoord.disconnect();
        ActionMessage disconnect(CMD_DISCONNECT);
        disconnect.source_id = mFedID;
        disconnect.dest_id = parent_broker_id;
        mQueueMessage(disconnect);
    }
    if (current_state != std::get<0>(proc_result)) {
        current_state = std::get<0>(proc_result);
        switch (current_state) {
            case FederateStates::INITIALIZING:
                mCoord.enteringExecMode(IterationRequest::NO_ITERATIONS);
                {
                    ActionMessage echeck{CMD_EXEC_CHECK};
                    echeck.dest_id = mFedID;
                    echeck.source_id = mFedID;
                    handleMessage(echeck);
                }
                break;
            case FederateStates::EXECUTING:
                mCoord.timeRequest(Time::maxVal(),
                                   IterationRequest::NO_ITERATIONS,
                                   Time::maxVal(),
                                   Time::maxVal());
                break;
            case FederateStates::FINISHED:
                break;
            case FederateStates::ERRORED: {
                std::string errorString;
                if (command.payload.empty()) {
                    errorString = commandErrorString(command.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(command.messageID);
                    }
                } else {
                    errorString = command.payload.to_string();
                }
                if (mLogger) {
                    mLogger(HELICS_LOG_LEVEL_ERROR, mName, errorString);
                }
            } break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (command.dest_id != mFedID) {
                mSendMessage(command);
                return;
            }
            return handleMessage(command);
        case MessageProcessingResult::DELAY_MESSAGE:
        default:
            return;
    }
    switch (command.action()) {
        case CMD_CLOSE_INTERFACE: {
            auto* tran = translators.find(command.getSource());
            if (tran != nullptr) {
                // TODO(PT) actually close the interface
            }
        } break;

        case CMD_REMOVE_ENDPOINT: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getEndpointInfo()->removeTarget(command.getSource());
            }
        } break;
        case CMD_REMOVE_PUBLICATION: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getInputInfo()->removeSource(command.getSource(), timeZero);
            }

        } break;
        case CMD_REMOVE_SUBSCRIBER: {
            auto* tranI = getTranslatorInfo(command.getDest());
            if (tranI != nullptr) {
                tranI->getPubInfo()->removeSubscriber(command.getSource());
            }

        } break;
        case CMD_ADD_PUBLISHER: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                tranI->getInputInfo()->addSource(command.getSource(),
                                                 command.name(),
                                                 command.getString(typeStringLoc),
                                                 command.getString(unitStringLoc));

                if (!checkActionFlag(command, error_flag)) {
                    mCoord.addDependency(command.source_id);
                }
            }
        } break;
        case CMD_ADD_SUBSCRIBER: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                tranI->getPubInfo()->addSubscriber(command.getSource(), command.name());

                if (!checkActionFlag(command, error_flag)) {
                    mCoord.addDependent(command.source_id);
                }
            }
        } break;
        case CMD_ADD_ENDPOINT: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                if (checkActionFlag(command, destination_target)) {
                    tranI->getEndpointInfo()->addDestination(command.getSource(),
                                                             command.name(),
                                                             command.getString(typeStringLoc));
                    if (!checkActionFlag(command, error_flag)) {
                        mCoord.addDependent(command.source_id);
                    }
                } else {
                    tranI->getEndpointInfo()->addSource(command.getSource(),
                                                        command.name(),
                                                        command.getString(typeStringLoc));
                    if (!checkActionFlag(command, error_flag)) {
                        mCoord.addDependency(command.source_id);
                    }
                }
            }

        } break;
        case CMD_CORE_CONFIGURE:
            if (command.messageID == UPDATE_TRANSLATOR_OPERATOR) {
                auto* tranI = getTranslatorInfo(mFedID, command.source_handle);
                if (tranI != nullptr) {
                    auto locker = mGetAirLock(command.counter).try_unload();
                    if (locker) {
                        auto operation =
                            std::any_cast<std::shared_ptr<TranslatorOperator>>(std::move(*locker));
                        tranI->tranOp = std::move(operation);
                    }
                }
            }
            break;
        case CMD_SEND_MESSAGE:
        case CMD_PUB: {
            auto* tranI = getTranslatorInfo(mFedID, command.dest_handle);
            if (tranI != nullptr) {
                executeTranslator(command, tranI);
            }
        } break;
        default:
            break;
    }
}